

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_expect_uint_match(mpack_reader_t *reader,uint64_t value)

{
  uint64_t uVar1;
  
  uVar1 = mpack_expect_u64(reader);
  if ((uVar1 != value) && (reader->error == mpack_ok)) {
    reader->error = mpack_error_type;
    reader->end = reader->data;
    if (reader->error_fn != (mpack_reader_error_t)0x0) {
      (*reader->error_fn)(reader,mpack_error_type);
      return;
    }
  }
  return;
}

Assistant:

void mpack_expect_uint_match(mpack_reader_t* reader, uint64_t value) {
    if (mpack_expect_u64(reader) != value)
        mpack_reader_flag_error(reader, mpack_error_type);
}